

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pca.hpp
# Opt level: O2

void print_debug_tensor(ggml_tensor *t,bool with_data)

{
  undefined8 uVar1;
  undefined7 in_register_00000031;
  size_t i;
  ulong uVar2;
  float fVar3;
  
  uVar1 = ggml_type_name(t->type,CONCAT71(in_register_00000031,with_data));
  printf("%s: %s (%s): [%d, %d]\n","print_debug_tensor",t->name,uVar1,(ulong)(uint)t->ne[0],
         (ulong)(uint)t->ne[1]);
  printf("%s: %s[0] = [","print_debug_tensor",t->name);
  for (uVar2 = 0; uVar2 != 6; uVar2 = uVar2 + 1) {
    fVar3 = (float)ggml_get_f32_nd(t,uVar2 & 0xffffffff,0,0,0);
    printf(" %f,",(double)fVar3);
  }
  puts(" ... ]");
  return;
}

Assistant:

static void print_debug_tensor(struct ggml_tensor * t, bool with_data = true) {
    printf("%s: %s (%s): [%d, %d]\n", __func__, t->name, ggml_type_name(t->type), (int) t->ne[0], (int) t->ne[1]);
    if (!with_data) return;
    printf("%s: %s[0] = [", __func__, t->name);
    for (size_t i = 0; i <= DEBUG_POS; i++) {
        printf(" %f,", ggml_get_f32_nd(t, i, 0, 0, 0));
    }
    printf(" ... ]\n");
}